

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O1

void __thiscall QStaticText::prepare(QStaticText *this,QTransform *matrix,QFont *font)

{
  QStaticTextPrivate *pQVar1;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  
  pQVar1 = (this->data).d.ptr;
  pqVar3 = (qreal *)matrix;
  pQVar4 = &pQVar1->matrix;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_matrix[0][0] = *pqVar3;
    pqVar3 = pqVar3 + 1;
    pQVar4 = (QTransform *)(pQVar4->m_matrix[0] + 1);
  }
  *(undefined2 *)&(pQVar1->matrix).field_0x48 = *(undefined2 *)&matrix->field_0x48;
  QFont::operator=(&((this->data).d.ptr)->font,font);
  QStaticTextPrivate::init((this->data).d.ptr,(EVP_PKEY_CTX *)font);
  return;
}

Assistant:

void QStaticText::prepare(const QTransform &matrix, const QFont &font)
{
    data->matrix = matrix;
    data->font = font;
    data->init();
}